

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_int&>,std::tuple<std::shared_ptr<ThreadState>&&>>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
           *this,size_t i,piecewise_construct_t *args,tuple<unsigned_int_&> *args_1,
          tuple<std::shared_ptr<ThreadState>_&&> *args_2)

{
  bool bVar1;
  allocator_type *alloc;
  reference ts;
  iterator i_00;
  const_iterator local_68;
  iterator local_58;
  FindElement local_48;
  iterator local_40;
  tuple<std::shared_ptr<ThreadState>_&&> *local_30;
  tuple<std::shared_ptr<ThreadState>_&&> *args_local_2;
  tuple<unsigned_int_&> *args_local_1;
  piecewise_construct_t *args_local;
  size_t i_local;
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  *this_local;
  
  local_30 = args_2;
  args_local_2 = (tuple<std::shared_ptr<ThreadState>_&&> *)args_1;
  args_local_1 = (tuple<unsigned_int_&> *)args;
  args_local = (piecewise_construct_t *)i;
  i_local = (size_t)this;
  alloc = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
          ::alloc_ref((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                       *)this);
  hash_policy_traits<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,void>
  ::
  construct<std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>,std::piecewise_construct_t_const&,std::tuple<unsigned_int&>,std::tuple<std::shared_ptr<ThreadState>&&>>
            (alloc,(slot_type *)(*(long *)(this + 8) + (long)args_local * 0x18),
             (piecewise_construct_t *)args_local_1,(tuple<unsigned_int_&> *)args_local_2,local_30);
  local_48.s = (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                *)this;
  local_58 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
             ::iterator_at((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                            *)this,(size_t)args_local);
  ts = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
       ::iterator::operator*(&local_58);
  local_40 = (iterator)
             hash_policy_traits<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,void>
             ::
             apply<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>::FindElement,std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>&,phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>>
                       (&local_48,ts);
  i_00 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
         ::iterator_at((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                        *)this,(size_t)args_local);
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  ::const_iterator::const_iterator(&local_68,i_00);
  bVar1 = container_internal::operator==((const_iterator *)&local_40,&local_68);
  if (!bVar1) {
    __assert_fail("PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) == iterator_at(i) && \"constructed value does not match the lookup key\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x802,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>>::emplace_at(size_t, Args &&...) [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>, Args = <const std::piecewise_construct_t &, std::tuple<unsigned int &>, std::tuple<std::shared_ptr<ThreadState> &&>>]"
                 );
  }
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);

        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
    }